

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

void * Cnf_DataWriteIntoSolverInt(void *pSolver,Cnf_Dat_t *p,int nFrames,int fInit)

{
  int iVar1;
  int iVar2;
  lit lVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  lit local_74;
  void *pvStack_70;
  int Lits_1 [1];
  Aig_Obj_t *pObjLo_1;
  int Lits [2];
  int *pLits;
  int nLitsAll;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjLo;
  int local_38;
  int status;
  int f;
  int i;
  sat_solver *pSat;
  int fInit_local;
  int nFrames_local;
  Cnf_Dat_t *p_local;
  void *pSolver_local;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfMan.c"
                  ,0x176,"void *Cnf_DataWriteIntoSolverInt(void *, Cnf_Dat_t *, int, int)");
  }
  if (pSolver == (void *)0x0) {
    __assert_fail("pSat",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfMan.c"
                  ,0x177,"void *Cnf_DataWriteIntoSolverInt(void *, Cnf_Dat_t *, int, int)");
  }
  sat_solver_setnvars((sat_solver *)pSolver,p->nVars * nFrames);
  for (status = 0; status < p->nClauses; status = status + 1) {
    iVar1 = sat_solver_addclause((sat_solver *)pSolver,p->pClauses[status],p->pClauses[status + 1]);
    if (iVar1 == 0) {
      sat_solver_delete((sat_solver *)pSolver);
      return (void *)0x0;
    }
  }
  if (1 < nFrames) {
    iVar1 = p->nVars * 2;
    Lits = *(int (*) [2])p->pClauses;
    for (local_38 = 1; local_38 < nFrames; local_38 = local_38 + 1) {
      for (status = 0; iVar2 = Aig_ManRegNum(p->pMan), status < iVar2; status = status + 1) {
        pAVar4 = Aig_ManLi(p->pMan,status);
        pAVar5 = Aig_ManLo(p->pMan,status);
        lVar3 = toLitCond(p->pVarNums[pAVar4->Id],0);
        pObjLo_1._0_4_ = (local_38 + -1) * iVar1 + lVar3;
        lVar3 = toLitCond(p->pVarNums[pAVar5->Id],1);
        pObjLo_1._4_4_ = local_38 * iVar1 + lVar3;
        iVar2 = sat_solver_addclause((sat_solver *)pSolver,(lit *)&pObjLo_1,Lits);
        if (iVar2 == 0) {
          sat_solver_delete((sat_solver *)pSolver);
          return (void *)0x0;
        }
        pObjLo_1._0_4_ = (int)pObjLo_1 + 1;
        pObjLo_1._4_4_ = pObjLo_1._4_4_ + -1;
        iVar2 = sat_solver_addclause((sat_solver *)pSolver,(lit *)&pObjLo_1,Lits);
        if (iVar2 == 0) {
          sat_solver_delete((sat_solver *)pSolver);
          return (void *)0x0;
        }
      }
      for (status = 0; status < p->nLiterals; status = status + 1) {
        *(int *)((long)Lits + (long)status * 4) = iVar1 + *(int *)((long)Lits + (long)status * 4);
      }
      for (status = 0; status < p->nClauses; status = status + 1) {
        iVar2 = sat_solver_addclause
                          ((sat_solver *)pSolver,p->pClauses[status],p->pClauses[status + 1]);
        if (iVar2 == 0) {
          sat_solver_delete((sat_solver *)pSolver);
          return (void *)0x0;
        }
      }
    }
    for (status = 0; status < p->nLiterals; status = status + 1) {
      *(int *)((long)Lits + (long)status * 4) =
           *(int *)((long)Lits + (long)status * 4) - (local_38 + -1) * iVar1;
    }
  }
  if (fInit != 0) {
    iVar1 = Aig_ManCiNum(p->pMan);
    iVar2 = Aig_ManRegNum(p->pMan);
    for (status = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->pMan->vCis), status < iVar1;
        status = status + 1) {
      pvStack_70 = Vec_PtrEntry(p->pMan->vCis,status);
      local_74 = toLitCond(p->pVarNums[*(int *)((long)pvStack_70 + 0x24)],1);
      iVar1 = sat_solver_addclause((sat_solver *)pSolver,&local_74,(lit *)&stack0xffffffffffffff90);
      if (iVar1 == 0) {
        sat_solver_delete((sat_solver *)pSolver);
        return (void *)0x0;
      }
    }
  }
  iVar1 = sat_solver_simplify((sat_solver *)pSolver);
  pSolver_local = pSolver;
  if (iVar1 == 0) {
    sat_solver_delete((sat_solver *)pSolver);
    pSolver_local = (void *)0x0;
  }
  return pSolver_local;
}

Assistant:

void * Cnf_DataWriteIntoSolverInt( void * pSolver, Cnf_Dat_t * p, int nFrames, int fInit )
{
	sat_solver * pSat = (sat_solver *)pSolver;
    int i, f, status;
    assert( nFrames > 0 );
    assert( pSat );
//    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, p->nVars * nFrames );
    for ( i = 0; i < p->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, p->pClauses[i], p->pClauses[i+1] ) )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    if ( nFrames > 1 )
    {
        Aig_Obj_t * pObjLo, * pObjLi;
        int nLitsAll, * pLits, Lits[2];
        nLitsAll = 2 * p->nVars;
        pLits = p->pClauses[0];
        for ( f = 1; f < nFrames; f++ )
        {
            // add equality of register inputs/outputs for different timeframes
            Aig_ManForEachLiLoSeq( p->pMan, pObjLi, pObjLo, i )
            {
                Lits[0] = (f-1)*nLitsAll + toLitCond( p->pVarNums[pObjLi->Id], 0 );
                Lits[1] =  f   *nLitsAll + toLitCond( p->pVarNums[pObjLo->Id], 1 );
                if ( !sat_solver_addclause( pSat, Lits, Lits + 2 ) )
                {
                    sat_solver_delete( pSat );
                    return NULL;
                }
                Lits[0]++;
                Lits[1]--;
                if ( !sat_solver_addclause( pSat, Lits, Lits + 2 ) )
                {
                    sat_solver_delete( pSat );
                    return NULL;
                }
            }
            // add clauses for the next timeframe
            for ( i = 0; i < p->nLiterals; i++ )
                pLits[i] += nLitsAll;
            for ( i = 0; i < p->nClauses; i++ )
            {
                if ( !sat_solver_addclause( pSat, p->pClauses[i], p->pClauses[i+1] ) )
                {
                    sat_solver_delete( pSat );
                    return NULL;
                }
            }
        }
        // return literals to their original state
        nLitsAll = (f-1) * nLitsAll;
        for ( i = 0; i < p->nLiterals; i++ )
            pLits[i] -= nLitsAll;
    }
    if ( fInit )
    {
        Aig_Obj_t * pObjLo;
        int Lits[1];
        Aig_ManForEachLoSeq( p->pMan, pObjLo, i )
        {
            Lits[0] = toLitCond( p->pVarNums[pObjLo->Id], 1 );
            if ( !sat_solver_addclause( pSat, Lits, Lits + 1 ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
        }
    }
    status = sat_solver_simplify(pSat);
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        return NULL;
    }
    return pSat;
}